

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void create_hostcache_id(char *name,int port,char *ptr,size_t buflen)

{
  char cVar1;
  size_t local_30;
  size_t len;
  size_t buflen_local;
  char *ptr_local;
  char *pcStack_10;
  int port_local;
  char *name_local;
  
  local_30 = strlen(name);
  buflen_local = (size_t)ptr;
  pcStack_10 = name;
  if (buflen - 7 < local_30) {
    local_30 = buflen - 7;
  }
  while (local_30 != 0) {
    cVar1 = Curl_raw_tolower(*pcStack_10);
    *(char *)buflen_local = cVar1;
    local_30 = local_30 - 1;
    buflen_local = buflen_local + 1;
    pcStack_10 = pcStack_10 + 1;
  }
  curl_msnprintf((char *)buflen_local,7,":%u",(ulong)(uint)port);
  return;
}

Assistant:

static void
create_hostcache_id(const char *name, int port, char *ptr, size_t buflen)
{
  size_t len = strlen(name);
  if(len > (buflen - 7))
    len = buflen - 7;
  /* store and lower case the name */
  while(len--)
    *ptr++ = Curl_raw_tolower(*name++);
  msnprintf(ptr, 7, ":%u", port);
}